

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

uint64_t pmull_h(uint64_t op1,uint64_t op2)

{
  uint64_t uVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 8;
  uVar1 = 0;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    uVar1 = uVar1 ^ (op1 & 0x1000100010001) * 0xffff & op2;
    op1 = op1 >> 1;
    op2 = op2 * 2;
  }
  return uVar1;
}

Assistant:

static uint64_t pmull_h(uint64_t op1, uint64_t op2)
{
    uint64_t result = 0;
    int i;

    for (i = 0; i < 8; ++i) {
        uint64_t mask = (op1 & 0x0001000100010001ull) * 0xffff;
        result ^= op2 & mask;
        op1 >>= 1;
        op2 <<= 1;
    }
    return result;
}